

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

FT_Pos af_hint_normal_stem(AF_GlyphHints hints,AF_Edge_conflict edge,AF_Edge_conflict edge2,
                          FT_Pos anchor,AF_Dimension dim)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  FT_Pos FVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar11;
  
  uVar1 = hints->other_flags;
  lVar6 = 0x40;
  if ((uVar1 & 4) == 0) {
    if (((edge->flags & 1) == 0) || ((edge2->flags & 1) == 0)) {
      lVar6 = (ulong)(dim == AF_DIMENSION_VERT) * 2 + 0x3b;
    }
    else {
      lVar6 = 0x31;
      if (dim == AF_DIMENSION_VERT) {
        lVar6 = 0x37;
      }
    }
  }
  lVar2 = edge2->opos;
  lVar3 = edge->opos;
  FVar4 = af_cjk_compute_stem_width(hints,dim,lVar2 - lVar3,(FT_UInt)anchor,dim);
  uVar5 = FVar4 / -2 + (lVar2 + lVar3) / 2 + anchor;
  uVar13 = (uint)uVar5 & 0x3f;
  uVar8 = 0;
  if ((uVar5 & 0x3f) == 0) {
LAB_0017c6d0:
    if ((uVar1 & 4) != 0) goto LAB_0017c6ec;
    if (0xe < (long)uVar8) {
      uVar8 = 0xe;
      goto LAB_0017c6ec;
    }
  }
  else {
    uVar10 = (uint)uVar5 + (uint)FVar4 & 0x3f;
    uVar11 = (ulong)uVar10;
    if (uVar10 == 0) goto LAB_0017c6d0;
    uVar12 = 0x40 - (ulong)uVar13;
    if (FVar4 <= lVar6) {
      if ((long)uVar11 < FVar4) {
        uVar8 = -uVar11;
        if (uVar12 <= uVar11) {
          uVar8 = uVar12;
        }
      }
      else {
        uVar8 = 0;
      }
      goto LAB_0017c6d0;
    }
    if ((uVar1 & 4) != 0) {
LAB_0017c653:
      uVar13 = (uint)FVar4 & 0x3f;
      uVar14 = (ulong)uVar13;
      if (uVar14 < 0x20) {
        uVar8 = 0;
        if (((uint)uVar12 <= uVar13) || (uVar8 = 0, uVar10 <= uVar13)) goto LAB_0017c6d0;
      }
      else {
        uVar14 = 0x40 - lVar6;
      }
      uVar15 = -(lVar6 - uVar12);
      if ((long)(uVar12 - uVar14) < (long)(lVar6 - uVar12)) {
        uVar15 = uVar12 - uVar14;
      }
      uVar8 = -(uVar11 - uVar14);
      if ((long)(lVar6 - uVar11) < (long)(uVar11 - uVar14)) {
        uVar8 = lVar6 - uVar11;
      }
      uVar11 = -uVar15;
      if (0 < (long)uVar15) {
        uVar11 = uVar15;
      }
      uVar12 = -uVar8;
      if (0 < (long)uVar8) {
        uVar12 = uVar8;
      }
      if ((uint)uVar11 <= (uint)uVar12) {
        uVar8 = uVar15;
      }
      goto LAB_0017c6d0;
    }
    uVar8 = 0;
    uVar9 = (uint)lVar6;
    if ((((uVar13 < uVar9) && ((uint)uVar12 < uVar9)) && (uVar10 < uVar9)) &&
       (uVar8 = 0, 0x40 - uVar10 < uVar9)) goto LAB_0017c653;
  }
  if ((long)uVar8 < -0xd) {
    uVar8 = 0xfffffffffffffff2;
  }
LAB_0017c6ec:
  lVar6 = uVar5 + uVar8;
  lVar7 = FVar4 + lVar6;
  if (lVar2 <= lVar3) {
    lVar7 = lVar6;
    lVar6 = FVar4 + lVar6;
  }
  edge->pos = lVar6;
  edge2->pos = lVar7;
  return uVar8;
}

Assistant:

static FT_Pos
  af_hint_normal_stem( AF_GlyphHints  hints,
                       AF_Edge        edge,
                       AF_Edge        edge2,
                       FT_Pos         anchor,
                       AF_Dimension   dim )
  {
    FT_Pos  org_len, cur_len, org_center;
    FT_Pos  cur_pos1, cur_pos2;
    FT_Pos  d_off1, u_off1, d_off2, u_off2, delta;
    FT_Pos  offset;
    FT_Pos  threshold = 64;


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
    {
      if ( ( edge->flags  & AF_EDGE_ROUND ) &&
           ( edge2->flags & AF_EDGE_ROUND ) )
      {
        if ( dim == AF_DIMENSION_VERT )
          threshold = 64 - AF_LIGHT_MODE_MAX_HORZ_GAP;
        else
          threshold = 64 - AF_LIGHT_MODE_MAX_VERT_GAP;
      }
      else
      {
        if ( dim == AF_DIMENSION_VERT )
          threshold = 64 - AF_LIGHT_MODE_MAX_HORZ_GAP / 3;
        else
          threshold = 64 - AF_LIGHT_MODE_MAX_VERT_GAP / 3;
      }
    }

    org_len    = edge2->opos - edge->opos;
    cur_len    = af_cjk_compute_stem_width( hints, dim, org_len,
                                            edge->flags,
                                            edge2->flags );

    org_center = ( edge->opos + edge2->opos ) / 2 + anchor;
    cur_pos1   = org_center - cur_len / 2;
    cur_pos2   = cur_pos1 + cur_len;
    d_off1     = cur_pos1 - FT_PIX_FLOOR( cur_pos1 );
    d_off2     = cur_pos2 - FT_PIX_FLOOR( cur_pos2 );
    u_off1     = 64 - d_off1;
    u_off2     = 64 - d_off2;
    delta      = 0;


    if ( d_off1 == 0 || d_off2 == 0 )
      goto Exit;

    if ( cur_len <= threshold )
    {
      if ( d_off2 < cur_len )
      {
        if ( u_off1 <= d_off2 )
          delta =  u_off1;
        else
          delta = -d_off2;
      }

      goto Exit;
    }

    if ( threshold < 64 )
    {
      if ( d_off1 >= threshold || u_off1 >= threshold ||
           d_off2 >= threshold || u_off2 >= threshold )
        goto Exit;
    }

    offset = cur_len & 63;

    if ( offset < 32 )
    {
      if ( u_off1 <= offset || d_off2 <= offset )
        goto Exit;
    }
    else
      offset = 64 - threshold;

    d_off1 = threshold - u_off1;
    u_off1 = u_off1    - offset;
    u_off2 = threshold - d_off2;
    d_off2 = d_off2    - offset;

    if ( d_off1 <= u_off1 )
      u_off1 = -d_off1;

    if ( d_off2 <= u_off2 )
      u_off2 = -d_off2;

    if ( FT_ABS( u_off1 ) <= FT_ABS( u_off2 ) )
      delta = u_off1;
    else
      delta = u_off2;

  Exit:

#if 1
    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
    {
      if ( delta > AF_LIGHT_MODE_MAX_DELTA_ABS )
        delta = AF_LIGHT_MODE_MAX_DELTA_ABS;
      else if ( delta < -AF_LIGHT_MODE_MAX_DELTA_ABS )
        delta = -AF_LIGHT_MODE_MAX_DELTA_ABS;
    }
#endif

    cur_pos1 += delta;

    if ( edge->opos < edge2->opos )
    {
      edge->pos  = cur_pos1;
      edge2->pos = cur_pos1 + cur_len;
    }
    else
    {
      edge->pos  = cur_pos1 + cur_len;
      edge2->pos = cur_pos1;
    }

    return delta;
  }